

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O0

Shape * trieste::wf::ops::operator<<=(Shape *__return_storage_ptr__,Token *type,Field *field)

{
  initializer_list<trieste::wf::Field> __l;
  Field *local_b0;
  allocator<trieste::wf::Field> local_85 [13];
  Field *local_78;
  Field local_70;
  undefined1 local_50 [16];
  Fields local_40;
  Field *local_20;
  Field *field_local;
  Token *type_local;
  
  local_78 = &local_70;
  local_20 = field;
  field_local = (Field *)type;
  type_local = &__return_storage_ptr__->type;
  Field::Field(local_78,field);
  local_50._0_8_ = &local_70;
  local_50._8_8_ = (pointer)0x1;
  std::allocator<trieste::wf::Field>::allocator(local_85);
  __l._M_len = local_50._8_8_;
  __l._M_array = (iterator)local_50._0_8_;
  std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>::vector
            ((vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_> *)(local_50 + 0x10),
             __l,local_85);
  Token::Token(&local_40.binding,(TokenDef *)Invalid);
  operator<<=(__return_storage_ptr__,&field_local->name,(Fields *)(local_50 + 0x10));
  Fields::~Fields((Fields *)(local_50 + 0x10));
  std::allocator<trieste::wf::Field>::~allocator(local_85);
  local_b0 = (Field *)local_50;
  do {
    local_b0 = local_b0 + -1;
    Field::~Field(local_b0);
  } while (local_b0 != &local_70);
  return __return_storage_ptr__;
}

Assistant:

inline Shape operator<<=(const Token& type, Field&& field)
      {
        return type <<= Fields{std::vector<Field>{field}, Invalid};
      }